

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_test.c
# Opt level: O3

void test_ptr(char *Format,intptr_t Value)

{
  int iVar1;
  char String [512];
  tchar_t tString [512];
  char acStack_428 [512];
  char local_228 [520];
  
  snprintf(acStack_428,0x200,Format,Value);
  stprintf_s(local_228,0x200,Format,Value);
  printf("Format %-8s: ",Format);
  iVar1 = strcasecmp(acStack_428,local_228);
  if (iVar1 == 0) {
    printf("passed \'%s\'\n",acStack_428);
  }
  else {
    printf("failed \'%s\' != \'%s\'\n",acStack_428,local_228);
  }
  return;
}

Assistant:

void test_ptr(const char *Format, intptr_t Value)
{
    char String[512];
    tchar_t tString[512];
    const tchar_t *format;
    char *corec;
#if defined(UNICODE)
    tchar_t tFormat[64];
    char corecString[512];
#endif

    snprintf(String,sizeof(String),Format,Value);
#if defined(UNICODE)
    CharConvTS(FromStr,tFormat,TSIZEOF(tFormat),Format);
    format = tFormat;
#else
    format = Format;
#endif
    stprintf_s(tString,TSIZEOF(tString),format,Value);

#if defined(UNICODE)
    CharConvST(ToStr,corecString,sizeof(corecString),tString);
    corec = corecString;
#else
    corec = tString;
#endif

    printf("Format %-8s: ",Format);
    if (strcasecmp(String,corec) != 0)
        printf("failed '%s' != '%s'\n",String,corec);
    else
        printf("passed '%s'\n",String);
}